

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

void Extra_TruthShrink(uint *pOut,uint *pIn,int nVars,int nVarsAll,uint Phase)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = 0;
  uVar2 = 0;
  if (0 < nVarsAll) {
    uVar2 = nVarsAll;
  }
  iVar6 = 0;
  bVar3 = false;
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    puVar1 = pIn;
    uVar4 = uVar5;
    if ((Phase >> (uVar5 & 0x1f) & 1) != 0) {
      while (pIn = puVar1, iVar6 < (int)uVar4) {
        Extra_TruthSwapAdjacentVars(pOut,pIn,nVarsAll,uVar4 - 1);
        bVar3 = (bool)(bVar3 ^ 1);
        puVar1 = pOut;
        pOut = pIn;
        uVar4 = uVar4 - 1;
      }
      iVar6 = iVar6 + 1;
    }
  }
  if (iVar6 != nVars) {
    __assert_fail("Var == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x11b,
                  "void Extra_TruthShrink(unsigned int *, unsigned int *, int, int, unsigned int)");
  }
  if (bVar3) {
    return;
  }
  Extra_TruthCopy(pOut,pIn,nVarsAll);
  return;
}

Assistant:

void Extra_TruthShrink( unsigned * pOut, unsigned * pIn, int nVars, int nVarsAll, unsigned Phase )
{
    unsigned * pTemp;
    int i, k, Var = 0, Counter = 0;
    for ( i = 0; i < nVarsAll; i++ )
        if ( Phase & (1 << i) )
        {
            for ( k = i-1; k >= Var; k-- )
            {
                Extra_TruthSwapAdjacentVars( pOut, pIn, nVarsAll, k );
                pTemp = pIn; pIn = pOut; pOut = pTemp;
                Counter++;
            }
            Var++;
        }
    assert( Var == nVars );
    // swap if it was moved an even number of times
    if ( !(Counter & 1) )
        Extra_TruthCopy( pOut, pIn, nVarsAll );
}